

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  int iVar1;
  void *in_RSI;
  lua_Alloc in_RDI;
  void *l;
  global_State *g;
  lua_State *L;
  int i;
  void *in_stack_000000a0;
  Pfunc in_stack_000000a8;
  lua_State *in_stack_000000b0;
  GCObject *g_00;
  GCObject *local_28;
  int local_1c;
  GCObject *local_8;
  
  local_28 = (GCObject *)(*in_RDI)(in_RSI,(void *)0x0,0,0x268);
  if (local_28 == (GCObject *)0x0) {
    local_8 = (GCObject *)0x0;
  }
  else {
    g_00 = local_28 + 1;
    (local_28->gch).next = (GCObject *)0x0;
    (local_28->gch).tt = '\b';
    *(undefined1 *)((long)local_28 + 0xd8) = 0x21;
    (local_28->gch).marked = *(byte *)((long)local_28 + 0xd8) & 3;
    (local_28->gch).marked = (local_28->gch).marked | 0x60;
    preinit_state(&local_28->th,(global_State *)&g_00->gch);
    (g_00->h).metatable = (Table *)in_RDI;
    (g_00->h).array = (TValue *)in_RSI;
    ((global_State *)g_00)->mainthread = (lua_State *)local_28;
    (((global_State *)g_00)->uvhead).u.l.prev = &((global_State *)g_00)->uvhead;
    (((global_State *)g_00)->uvhead).u.l.next = &((global_State *)g_00)->uvhead;
    (g_00->th).hook = (lua_Hook)0x0;
    ((stringtable *)&(g_00->gch).next)->size = 0;
    ((stringtable *)&(g_00->gch).next)->nuse = 0;
    ((stringtable *)&(g_00->gch).next)->hash = (GCObject **)0x0;
    (((local_28->th).l_G)->l_registry).tt = 0;
    ((Mbuffer *)&(g_00->p).sizep)->buffer = (char *)0x0;
    ((Mbuffer *)&(g_00->p).sizep)->buffsize = 0;
    (g_00->th).openupval = (GCObject *)0x0;
    (g_00->h).node = '\0';
    (g_00->h).lastfree = (Node *)local_28;
    *(int *)&(g_00->h).node = 0;
    (g_00->h).gclist = (GCObject *)&(g_00->h).lastfree;
    (g_00->p).upvalues = (TString **)0x0;
    (g_00->p).source = (TString *)0x0;
    (g_00->th).end_ci = (CallInfo *)0x0;
    (g_00->th).base_ci = (CallInfo *)0x0;
    *(lu_mem *)&(g_00->th).l_gt = 0x268;
    *(int *)&(g_00->th).env = 200;
    *(int *)&(g_00->th).env = 200;
    *(lu_mem *)&(g_00->th).env = 0;
    for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
      ((global_State *)g_00)->mt[local_1c] = (Table *)0x0;
    }
    iVar1 = luaD_rawrunprotected(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    if (iVar1 != 0) {
      close_state(&g_00->th);
      local_28 = (GCObject *)0x0;
    }
    local_8 = local_28;
  }
  return (lua_State *)local_8;
}

Assistant:

static lua_State*lua_newstate(lua_Alloc f,void*ud){
int i;
lua_State*L;
global_State*g;
void*l=(*f)(ud,NULL,0,state_size(LG));
if(l==NULL)return NULL;
L=tostate(l);
g=&((LG*)L)->g;
L->next=NULL;
L->tt=8;
g->currentwhite=bit2mask(0,5);
L->marked=luaC_white(g);
set2bits(L->marked,5,6);
preinit_state(L,g);
g->frealloc=f;
g->ud=ud;
g->mainthread=L;
g->uvhead.u.l.prev=&g->uvhead;
g->uvhead.u.l.next=&g->uvhead;
g->GCthreshold=0;
g->strt.size=0;
g->strt.nuse=0;
g->strt.hash=NULL;
setnilvalue(registry(L));
luaZ_initbuffer(L,&g->buff);
g->panic=NULL;
g->gcstate=0;
g->rootgc=obj2gco(L);
g->sweepstrgc=0;
g->sweepgc=&g->rootgc;
g->gray=NULL;
g->grayagain=NULL;
g->weak=NULL;
g->tmudata=NULL;
g->totalbytes=sizeof(LG);
g->gcpause=200;
g->gcstepmul=200;
g->gcdept=0;
for(i=0;i<(8+1);i++)g->mt[i]=NULL;
if(luaD_rawrunprotected(L,f_luaopen,NULL)!=0){
close_state(L);
L=NULL;
}
else
{}
return L;
}